

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
eglu::getExtensions_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,eglu *this,Library *egl,EGLDisplay display)

{
  deUint32 err;
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  __s = (char *)(**(code **)(*(long *)this + 0x150))(this,egl,0x3055);
  err = (**(code **)(*(long *)this + 0xf8))(this);
  checkError(err,"Querying extensions failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x4b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  de::splitString(__return_storage_ptr__,&local_38,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> getExtensions (const Library& egl, EGLDisplay display)
{
	const char*	const extensionStr = egl.queryString(display, EGL_EXTENSIONS);

	EGLU_CHECK_MSG(egl, "Querying extensions failed");

	return de::splitString(extensionStr, ' ');
}